

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_function_prototype
          (CompilerMSL *this,SPIRFunction *func,Bitset *param_2)

{
  SPIRType *pSVar1;
  Parameter *pPVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Types TVar6;
  Variant *pVVar7;
  Parameter *pPVar8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char (*local_480) [3];
  char (*local_460) [3];
  undefined1 local_370 [67];
  byte local_32d;
  VariableID local_32c;
  undefined1 local_328 [3];
  bool arg_is_array_1;
  spirv_cross local_308 [39];
  byte local_2e1;
  undefined1 local_2e0 [7];
  bool arg_is_array;
  undefined1 local_2c0 [64];
  char *local_280;
  char *sampler_address_space;
  undefined1 local_258 [64];
  undefined1 local_218 [68];
  uint local_1d4;
  __node_base _Stack_1d0;
  uint32_t i;
  MSLConstexprSampler *constexpr_sampler;
  SPIRType *pSStack_1c0;
  uint32_t planes;
  SPIRType *arg_type;
  undefined1 local_1b0 [7];
  bool is_dynamic_img_sampler;
  SPIRVariable *local_190;
  SPIRVariable *var;
  Parameter *pPStack_180;
  uint32_t name_id;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  TypedID *local_158;
  ID *initializer;
  SPIRVariable *ed_var;
  TypedID<(spirv_cross::Types)0> *pTStack_140;
  uint var_id;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_120;
  undefined1 local_118 [32];
  undefined1 local_f8 [64];
  string local_b8 [32];
  string local_98 [32];
  undefined1 local_78 [40];
  SPIRType *type;
  string decl;
  Bitset *param_2_local;
  SPIRFunction *func_local;
  CompilerMSL *this_local;
  
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  uVar5 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (uVar4 != uVar5) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_CompilerGLSL).local_variable_names,
              &(this->super_CompilerGLSL).resource_names);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffffc0);
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  uVar5 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  (this->super_CompilerGLSL).processing_entry_point = uVar4 == uVar5;
  if (((this->super_CompilerGLSL).processing_entry_point & 1U) == 0) {
    CompilerGLSL::statement<char_const*&>(&this->super_CompilerGLSL,&force_inline);
  }
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).field_0xc);
  local_78._32_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
  bVar3 = VectorView<unsigned_int>::empty
                    (&(((SPIRType *)local_78._32_8_)->array).super_VectorView<unsigned_int>);
  if ((bVar3) || (((this->msl_options).force_native_arrays & 1U) == 0)) {
    func_type_decl_abi_cxx11_((CompilerMSL *)local_78,(SPIRType *)this);
    ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,(string *)local_78);
    ::std::__cxx11::string::~string((string *)local_78);
  }
  else {
    ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,"void");
  }
  ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0," ");
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_98,this,(ulong)uVar4,1);
  ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,local_98);
  ::std::__cxx11::string::~string(local_98);
  ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,"(");
  bVar3 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(local_78._32_8_ + 0x20));
  if ((!bVar3) && (((this->msl_options).force_native_arrays & 1U) != 0)) {
    ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,"thread ");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_b8,this,local_78._32_8_,0);
    ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,local_b8);
    ::std::__cxx11::string::~string(local_b8);
    ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0," (&spvReturnValue)");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])
              (local_f8 + 0x20,this,local_78._32_8_);
    ::std::__cxx11::string::operator+=
              ((string *)&stack0xffffffffffffffc0,(string *)(local_f8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_f8 + 0x20));
    bVar3 = VectorView<spirv_cross::SPIRFunction::Parameter>::empty
                      (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
    if (!bVar3) {
      ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,", ");
    }
  }
  if (((this->super_CompilerGLSL).processing_entry_point & 1U) != 0) {
    if (((this->msl_options).argument_buffers & 1U) == 0) {
      VectorView<spirv_cross::SPIRFunction::Parameter>::empty
                (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
      entry_point_args_classic_abi_cxx11_((CompilerMSL *)local_118,SUB81(this,0));
      ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,(string *)local_118);
      ::std::__cxx11::string::~string((string *)local_118);
    }
    else {
      VectorView<spirv_cross::SPIRFunction::Parameter>::empty
                (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
      entry_point_args_argument_buffer_abi_cxx11_((CompilerMSL *)local_f8,SUB81(this,0));
      ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,(string *)local_f8);
      ::std::__cxx11::string::~string((string *)local_f8);
    }
    this_00 = &(this->super_CompilerGLSL).resource_names;
    local_120._M_cur =
         (__node_type *)
         ::std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this_00);
    __range2 = (SmallVector<unsigned_int,_8UL> *)
               ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_00);
    ::std::
    unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::insert<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
              ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this->super_CompilerGLSL).local_variable_names,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )local_120._M_cur,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )__range2);
    __begin2 = (uint *)&this->vars_needing_early_declaration;
    __end2 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
    pTStack_140 = (TypedID<(spirv_cross::Types)0> *)
                  VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2);
    for (; (TypedID<(spirv_cross::Types)0> *)__end2 != pTStack_140; __end2 = __end2 + 1) {
      ed_var._4_4_ = *__end2;
      initializer = (ID *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ed_var._4_4_);
      local_158 = (TypedID *)&((SPIRVariable *)initializer)->initializer;
      uVar4 = TypedID::operator_cast_to_unsigned_int(local_158);
      if (uVar4 == 0) {
        uVar4 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)((long)&__range1 + 4),uVar4);
        *(uint32_t *)local_158 = __range1._4_4_;
      }
      uVar4 = TypedID::operator_cast_to_unsigned_int(local_158);
      pVVar7 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>,(ulong)uVar4);
      TVar6 = Variant::get_type(pVVar7);
      if (TVar6 == TypeNone) {
LAB_004a03e2:
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)(initializer + 6));
        __range1._3_1_ = 1;
        Compiler::
        set<spirv_cross::SPIRExpression,char_const(&)[3],spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                  ((Compiler *)this,uVar4,(char (*) [3])0x5c4ded,
                   (TypedID<(spirv_cross::Types)1> *)(initializer + 3),(bool *)((long)&__range1 + 3)
                  );
      }
      else {
        uVar4 = TypedID::operator_cast_to_unsigned_int(local_158);
        pVVar7 = VectorView<spirv_cross::Variant>::operator[]
                           (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>,(ulong)uVar4);
        TVar6 = Variant::get_type(pVVar7);
        if (TVar6 == TypeExpression) goto LAB_004a03e2;
      }
    }
  }
  __begin1 = (Parameter *)&func->arguments;
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                  ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  for (; __end1 != arg; __end1 = __end1 + 1) {
    pPStack_180 = __end1;
    var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_180->id);
    local_190 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar4);
    if (local_190 != (SPIRVariable *)0x0) {
      if (((pPStack_180->alias_global_variable & 1U) != 0) &&
         (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_190->basevariable),
         uVar4 != 0)) {
        var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_190->basevariable);
      }
      local_190->parameter = pPStack_180;
    }
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,var._4_4_);
    argument_decl_abi_cxx11_((CompilerMSL *)local_1b0,(Parameter *)this);
    ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,(string *)local_1b0);
    ::std::__cxx11::string::~string((string *)local_1b0);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_180->id);
    arg_type._7_1_ =
         Compiler::has_extended_decoration
                   ((Compiler *)this,uVar4,SPIRVCrossDecorationDynamicImageSampler);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)pPStack_180);
    pSStack_1c0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
    uVar4 = (uint32_t)this;
    if ((*(int *)&(pSStack_1c0->super_IVariant).field_0xc == 0x11) && ((arg_type._7_1_ & 1) == 0)) {
      constexpr_sampler._4_4_ = 1;
      _Stack_1d0._M_nxt = (_Hash_node_base *)find_constexpr_sampler(this,var._4_4_);
      if (((MSLConstexprSampler *)_Stack_1d0._M_nxt != (MSLConstexprSampler *)0x0) &&
         ((((MSLConstexprSampler *)_Stack_1d0._M_nxt)->ycbcr_conversion_enable & 1U) != 0)) {
        constexpr_sampler._4_4_ = ((MSLConstexprSampler *)_Stack_1d0._M_nxt)->planes;
      }
      for (local_1d4 = 1; local_1d4 < constexpr_sampler._4_4_; local_1d4 = local_1d4 + 1) {
        argument_decl_abi_cxx11_((CompilerMSL *)local_218,(Parameter *)this);
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  ((spirv_cross *)(local_218 + 0x20),(char (*) [3])0x5cb8ef,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                   &this->plane_name_suffix,&local_1d4);
        ::std::__cxx11::string::operator+=
                  ((string *)&stack0xffffffffffffffc0,(string *)(local_218 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_218 + 0x20));
        ::std::__cxx11::string::~string((string *)local_218);
      }
      if ((pSStack_1c0->image).dim != DimBuffer) {
        bVar3 = VectorView<unsigned_int>::empty
                          (&(pSStack_1c0->array).super_VectorView<unsigned_int>);
        pSVar1 = pSStack_1c0;
        if (bVar3) {
          TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_180->id);
          sampler_type_abi_cxx11_((CompilerMSL *)local_258,(SPIRType *)this,(uint32_t)pSVar1);
          TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_180->id);
          to_sampler_expression_abi_cxx11_((CompilerMSL *)&sampler_address_space,uVar4);
          join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                    ((spirv_cross *)(local_258 + 0x20),(char (*) [3])0x5cb8ef,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     (char (*) [2])0x5b521c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sampler_address_space);
          ::std::__cxx11::string::operator+=
                    ((string *)&stack0xffffffffffffffc0,(string *)(local_258 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_258 + 0x20));
          ::std::__cxx11::string::~string((string *)&sampler_address_space);
          ::std::__cxx11::string::~string((string *)local_258);
        }
        else {
          local_280 = descriptor_address_space
                                (this,var._4_4_,StorageClassUniformConstant,"thread const");
          pSVar1 = pSStack_1c0;
          TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_180->id);
          sampler_type_abi_cxx11_((CompilerMSL *)local_2c0,(SPIRType *)this,(uint32_t)pSVar1);
          TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_180->id);
          to_sampler_expression_abi_cxx11_((CompilerMSL *)local_2e0,uVar4);
          join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                    ((spirv_cross *)(local_2c0 + 0x20),(char (*) [3])0x5cb8ef,&local_280,
                     (char (*) [2])0x5b521c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                     (char (*) [3])0x5ca60e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0)
          ;
          ::std::__cxx11::string::operator+=
                    ((string *)&stack0xffffffffffffffc0,(string *)(local_2c0 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_2c0 + 0x20));
          ::std::__cxx11::string::~string((string *)local_2e0);
          ::std::__cxx11::string::~string((string *)local_2c0);
        }
      }
    }
    if ((((((this->msl_options).swizzle_texture_samples & 1U) != 0) &&
         ((this->has_sampled_images & 1U) != 0)) &&
        (bVar3 = Compiler::is_sampled_image_type((Compiler *)this,pSStack_1c0), bVar3)) &&
       ((arg_type._7_1_ & 1) == 0)) {
      bVar3 = VectorView<unsigned_int>::empty(&(pSStack_1c0->array).super_VectorView<unsigned_int>);
      local_2e1 = (bVar3 ^ 0xffU) & 1;
      if (local_2e1 == 0) {
        local_460 = (char (*) [3])0x5ca60e;
      }
      else {
        local_460 = (char (*) [3])0x5cb7d9;
      }
      TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_180->id);
      to_swizzle_expression_abi_cxx11_((CompilerMSL *)local_328,uVar4);
      join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                (local_308,(char (*) [16])", constant uint",local_460,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
      ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,(string *)local_308);
      ::std::__cxx11::string::~string((string *)local_308);
      ::std::__cxx11::string::~string((string *)local_328);
    }
    TypedID<(spirv_cross::Types)2>::TypedID(&local_32c,var._4_4_);
    bVar3 = buffer_requires_array_length(this,local_32c);
    if (bVar3) {
      bVar3 = VectorView<unsigned_int>::empty(&(pSStack_1c0->array).super_VectorView<unsigned_int>);
      local_32d = (bVar3 ^ 0xffU) & 1;
      if (local_32d == 0) {
        local_480 = (char (*) [3])0x5ca60e;
      }
      else {
        local_480 = (char (*) [3])0x5cb7d9;
      }
      to_buffer_size_expression_abi_cxx11_((CompilerMSL *)local_370,uVar4);
      join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                ((spirv_cross *)(local_370 + 0x20),(char (*) [16])", constant uint",local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370);
      ::std::__cxx11::string::operator+=
                ((string *)&stack0xffffffffffffffc0,(string *)(local_370 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_370 + 0x20));
      ::std::__cxx11::string::~string((string *)local_370);
    }
    pPVar2 = pPStack_180;
    pPVar8 = VectorView<spirv_cross::SPIRFunction::Parameter>::back
                       (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
    if (pPVar2 != pPVar8) {
      ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,", ");
    }
  }
  ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,")");
  CompilerGLSL::statement<std::__cxx11::string&>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void CompilerMSL::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	processing_entry_point = func.self == ir.default_entry_point;

	// Metal helper functions must be static force-inline otherwise they will cause problems when linked together in a single Metallib.
	if (!processing_entry_point)
		statement(force_inline);

	auto &type = get<SPIRType>(func.return_type);

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// We cannot return native arrays in MSL, so "return" through an out variable.
		decl += "void";
	}
	else
	{
		decl += func_type_decl(type);
	}

	decl += " ";
	decl += to_name(func.self);
	decl += "(";

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// Fake arrays returns by writing to an out array instead.
		decl += "thread ";
		decl += type_to_glsl(type);
		decl += " (&spvReturnValue)";
		decl += type_to_array_glsl(type);
		if (!func.arguments.empty())
			decl += ", ";
	}

	if (processing_entry_point)
	{
		if (msl_options.argument_buffers)
			decl += entry_point_args_argument_buffer(!func.arguments.empty());
		else
			decl += entry_point_args_classic(!func.arguments.empty());

		// append entry point args to avoid conflicts in local variable names.
		local_variable_names.insert(resource_names.begin(), resource_names.end());

		// If entry point function has variables that require early declaration,
		// ensure they each have an empty initializer, creating one if needed.
		// This is done at this late stage because the initialization expression
		// is cleared after each compilation pass.
		for (auto var_id : vars_needing_early_declaration)
		{
			auto &ed_var = get<SPIRVariable>(var_id);
			ID &initializer = ed_var.initializer;
			if (!initializer)
				initializer = ir.increase_bound_by(1);

			// Do not override proper initializers.
			if (ir.ids[initializer].get_type() == TypeNone || ir.ids[initializer].get_type() == TypeExpression)
				set<SPIRExpression>(ed_var.initializer, "{}", ed_var.basetype, true);
		}
	}

	for (auto &arg : func.arguments)
	{
		uint32_t name_id = arg.id;

		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
		{
			// If we need to modify the name of the variable, make sure we modify the original variable.
			// Our alias is just a shadow variable.
			if (arg.alias_global_variable && var->basevariable)
				name_id = var->basevariable;

			var->parameter = &arg; // Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		}

		add_local_variable_name(name_id);

		decl += argument_decl(arg);

		bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);

		auto &arg_type = get<SPIRType>(arg.type);
		if (arg_type.basetype == SPIRType::SampledImage && !is_dynamic_img_sampler)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (auto *constexpr_sampler = find_constexpr_sampler(name_id))
				if (constexpr_sampler->ycbcr_conversion_enable)
					planes = constexpr_sampler->planes;
			for (uint32_t i = 1; i < planes; i++)
				decl += join(", ", argument_decl(arg), plane_name_suffix, i);

			// Manufacture automatic sampler arg for SampledImage texture
			if (arg_type.image.dim != DimBuffer)
			{
				if (arg_type.array.empty())
				{
					decl += join(", ", sampler_type(arg_type, arg.id), " ", to_sampler_expression(arg.id));
				}
				else
				{
					const char *sampler_address_space =
							descriptor_address_space(name_id,
							                         StorageClassUniformConstant,
							                         "thread const");
					decl += join(", ", sampler_address_space, " ", sampler_type(arg_type, arg.id), "& ", to_sampler_expression(arg.id));
				}
			}
		}

		// Manufacture automatic swizzle arg.
		if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(arg_type) &&
		    !is_dynamic_img_sampler)
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_swizzle_expression(arg.id));
		}

		if (buffer_requires_array_length(name_id))
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_buffer_size_expression(name_id));
		}

		if (&arg != &func.arguments.back())
			decl += ", ";
	}

	decl += ")";
	statement(decl);
}